

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.cpp
# Opt level: O0

void __thiscall
VBitmap::VBitmap(VBitmap *this,uint8_t *data,size_t width,size_t height,size_t bytesPerLine,
                Format format)

{
  unsigned_long *in_RCX;
  uchar **in_RDX;
  vshared_ptr<VBitmap::Impl,_unsigned_long> *in_RSI;
  vshared_ptr<VBitmap::Impl,_unsigned_long> *in_RDI;
  unsigned_long *in_R8;
  char in_R9B;
  vshared_ptr<VBitmap::Impl,_unsigned_long> *in_stack_ffffffffffffffb8;
  Format *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  vshared_ptr<VBitmap::Impl,_unsigned_long>::vshared_ptr(in_RDI);
  if ((((in_RSI != (vshared_ptr<VBitmap::Impl,_unsigned_long> *)0x0) && (in_RDX != (uchar **)0x0))
      && (in_RCX != (unsigned_long *)0x0)) && ((in_R8 != (unsigned_long *)0x0 && (in_R9B != '\0'))))
  {
    vshared_ptr<VBitmap::Impl,unsigned_long>::
    vshared_ptr<unsigned_char*&,unsigned_long&,unsigned_long&,unsigned_long&,VBitmap::Format&>
              (in_RSI,in_RDX,in_RCX,in_R8,
               (unsigned_long *)CONCAT17(in_R9B,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
              );
    vshared_ptr<VBitmap::Impl,_unsigned_long>::operator=(in_RDI,in_stack_ffffffffffffffb8);
    vshared_ptr<VBitmap::Impl,_unsigned_long>::~vshared_ptr
              ((vshared_ptr<VBitmap::Impl,_unsigned_long> *)0x115ed8);
  }
  return;
}

Assistant:

VBitmap::VBitmap(uint8_t *data, size_t width, size_t height,
                 size_t bytesPerLine, VBitmap::Format format)
{
    if (!data || width <= 0 || height <= 0 || bytesPerLine <= 0 ||
        format == Format::Invalid)
        return;

    mImpl = rc_ptr<Impl>(data, width, height, bytesPerLine, format);
}